

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void * __thiscall
ctemplate::BaseArena::GetMemoryFallback(BaseArena *this,size_t size,int align_as_int)

{
  ulong uVar1;
  AllocatedBlock *pAVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (size == 0) {
    return (void *)0x0;
  }
  if (0 < align_as_int) {
    uVar5 = (ulong)align_as_int;
    uVar1 = uVar5 - 1;
    if ((uVar5 & uVar1) == 0) {
      if (this->block_size_ >> 2 < size) {
        if ((uint)align_as_int < 9) {
          pAVar2 = AllocNewBlock(this,size);
          return pAVar2->mem;
        }
        __assert_fail("align <= kDefaultAlignment",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                      ,0x116,
                      "void *ctemplate::BaseArena::GetMemoryFallback(const size_t, const int)");
      }
      pcVar3 = this->freestart_;
      if ((uVar1 & (ulong)pcVar3) == 0) {
        uVar4 = this->remaining_;
      }
      else {
        uVar5 = uVar5 - (uVar1 & (ulong)pcVar3);
        pcVar3 = pcVar3 + uVar5;
        this->freestart_ = pcVar3;
        uVar4 = 0;
        if (uVar5 <= this->remaining_) {
          uVar4 = this->remaining_ - uVar5;
        }
        this->remaining_ = uVar4;
      }
      if (uVar4 < size) {
        MakeNewBlock(this);
        uVar4 = this->remaining_;
        pcVar3 = this->freestart_;
      }
      this->remaining_ = uVar4 - size;
      this->last_alloc_ = pcVar3;
      this->freestart_ = pcVar3 + size;
      if ((uVar1 & (ulong)pcVar3) == 0) {
        return pcVar3;
      }
      __assert_fail("0 == (reinterpret_cast<uintptr_t>(last_alloc_) & (align-1))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                    ,0x12d,"void *ctemplate::BaseArena::GetMemoryFallback(const size_t, const int)")
      ;
    }
  }
  __assert_fail("align_as_int > 0 && 0 == (align & (align - 1))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                ,0x110,"void *ctemplate::BaseArena::GetMemoryFallback(const size_t, const int)");
}

Assistant:

void* BaseArena::GetMemoryFallback(const size_t size, const int align_as_int) {
  if (0 == size) {
    return NULL;             // stl/stl_alloc.h says this is okay
  }
  // This makes the type-checker happy.
  const size_t align = static_cast<size_t>(align_as_int);

  assert(align_as_int > 0 && 0 == (align & (align - 1))); // must be power of 2

  // If the object is more than a quarter of the block size, allocate
  // it separately to avoid wasting too much space in leftover bytes
  if (block_size_ == 0 || size > block_size_/4) {
    // then it gets its own block in the arena
    assert(align <= kDefaultAlignment);   // because that's what new gives us
    // This block stays separate from the rest of the world; in particular
    // we don't update last_alloc_ so you can't reclaim space on this block.
    return AllocNewBlock(size)->mem;
  }

  const size_t overage =
    (reinterpret_cast<uintptr_t>(freestart_) & (align-1));
  if (overage) {
    const size_t waste = align - overage;
    freestart_ += waste;
    if (waste < remaining_) {
      remaining_ -= waste;
    } else {
      remaining_ = 0;
    }
  }
  if (size > remaining_) {
    MakeNewBlock();
  }
  remaining_ -= size;
  last_alloc_ = freestart_;
  freestart_ += size;
  assert(0 == (reinterpret_cast<uintptr_t>(last_alloc_) & (align-1)));
  return reinterpret_cast<void*>(last_alloc_);
}